

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O1

void start_pass_2_quant(j_decompress_ptr cinfo,boolean is_pre_scan)

{
  int iVar1;
  jpeg_color_quantizer *pjVar2;
  _func_void_j_decompress_ptr *p_Var3;
  size_t __n;
  _func_void_j_decompress_ptr_boolean *p_Var4;
  code *pcVar5;
  undefined4 uVar6;
  long lVar7;
  
  pjVar2 = cinfo->cquantize;
  p_Var3 = pjVar2[1].finish_pass;
  if (cinfo->dither_mode != JDITHER_NONE) {
    cinfo->dither_mode = JDITHER_FS;
  }
  if (is_pre_scan == 0) {
    pcVar5 = pass2_no_dither;
    if (cinfo->dither_mode == JDITHER_FS) {
      pcVar5 = pass2_fs_dither;
    }
    pjVar2->color_quantize = pcVar5;
    pjVar2->finish_pass = finish_pass2;
    iVar1 = cinfo->actual_number_of_colors;
    if (iVar1 < 1) {
      *(undefined8 *)&cinfo->err->msg_code = 0x10000003a;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (0x100 < iVar1) {
      *(undefined8 *)&cinfo->err->msg_code = 0x1000000003b;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->dither_mode != JDITHER_FS) goto LAB_0027ff8c;
    __n = (ulong)(cinfo->output_width + 2) * 6;
    if (pjVar2[2].start_pass == (_func_void_j_decompress_ptr_boolean *)0x0) {
      p_Var4 = (_func_void_j_decompress_ptr_boolean *)
               (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,__n);
      pjVar2[2].start_pass = p_Var4;
    }
    uVar6 = 0;
    memset(pjVar2[2].start_pass,0,__n);
    lVar7 = 0x48;
    if (pjVar2[2].finish_pass == (_func_void_j_decompress_ptr *)0x0) {
      init_error_limit(cinfo);
    }
  }
  else {
    pjVar2->color_quantize = prescan_quantize;
    pjVar2->finish_pass = finish_pass1;
    uVar6 = 1;
    lVar7 = 0x38;
  }
  *(undefined4 *)((long)&pjVar2->start_pass + lVar7) = uVar6;
LAB_0027ff8c:
  if (*(int *)&pjVar2[1].new_color_map != 0) {
    lVar7 = 0;
    do {
      memset(*(void **)(p_Var3 + lVar7 * 8),0,0x1000);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    *(undefined4 *)&pjVar2[1].new_color_map = 0;
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_2_quant (j_decompress_ptr cinfo, boolean is_pre_scan)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  int i;

  /* Only F-S dithering or no dithering is supported. */
  /* If user asks for ordered dither, give him F-S. */
  if (cinfo->dither_mode != JDITHER_NONE)
    cinfo->dither_mode = JDITHER_FS;

  if (is_pre_scan) {
    /* Set up method pointers */
    cquantize->pub.color_quantize = prescan_quantize;
    cquantize->pub.finish_pass = finish_pass1;
    cquantize->needs_zeroed = TRUE; /* Always zero histogram */
  } else {
    /* Set up method pointers */
    if (cinfo->dither_mode == JDITHER_FS)
      cquantize->pub.color_quantize = pass2_fs_dither;
    else
      cquantize->pub.color_quantize = pass2_no_dither;
    cquantize->pub.finish_pass = finish_pass2;

    /* Make sure color count is acceptable */
    i = cinfo->actual_number_of_colors;
    if (i < 1)
      ERREXIT1(cinfo, JERR_QUANT_FEW_COLORS, 1);
    if (i > MAXNUMCOLORS)
      ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXNUMCOLORS);

    if (cinfo->dither_mode == JDITHER_FS) {
      size_t arraysize = (size_t) ((cinfo->output_width + 2) *
				   (3 * SIZEOF(FSERROR)));
      /* Allocate Floyd-Steinberg workspace if we didn't already. */
      if (cquantize->fserrors == NULL)
	cquantize->fserrors = (FSERRPTR) (*cinfo->mem->alloc_large)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, arraysize);
      /* Initialize the propagated errors to zero. */
      FMEMZERO((void FAR *) cquantize->fserrors, arraysize);
      /* Make the error-limit table if we didn't already. */
      if (cquantize->error_limiter == NULL)
	init_error_limit(cinfo);
      cquantize->on_odd_row = FALSE;
    }

  }
  /* Zero the histogram or inverse color map, if necessary */
  if (cquantize->needs_zeroed) {
    for (i = 0; i < HIST_C0_ELEMS; i++) {
      FMEMZERO((void FAR *) histogram[i],
	       HIST_C1_ELEMS*HIST_C2_ELEMS * SIZEOF(histcell));
    }
    cquantize->needs_zeroed = FALSE;
  }
}